

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniforms.cpp
# Opt level: O0

void __thiscall
UniformData::parse(UniformData *this,
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *_command,size_t _start,bool _queue)

{
  size_type sVar1;
  const_reference _string;
  reference pvVar2;
  float fVar3;
  ulong local_40;
  size_t i;
  UniformValue candidate;
  bool _queue_local;
  size_t _start_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *_command_local;
  UniformData *this_local;
  
  candidate._M_elems[2]._3_1_ = _queue;
  unique0x100000d0 = _start;
  for (local_40 = _start;
      sVar1 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(_command), local_40 < sVar1 && local_40 < 5; local_40 = local_40 + 1) {
    _string = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[](_command,local_40);
    fVar3 = vera::toFloat(_string);
    pvVar2 = std::array<float,_4UL>::operator[]
                       ((array<float,_4UL> *)((long)&i + 4),local_40 - stack0xffffffffffffffe0);
    *pvVar2 = fVar3;
  }
  sVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(_command);
  set(this,(UniformValue *)((long)&i + 4),sVar1 - stack0xffffffffffffffe0,false,
      (bool)(candidate._M_elems[2]._3_1_ & 1));
  return;
}

Assistant:

void UniformData::parse(const std::vector<std::string>& _command, size_t _start, bool _queue) {;
    UniformValue candidate;
    for (size_t i = _start; i < _command.size() && i < 5; i++) 
        candidate[i-_start] = vera::toFloat(_command[i]);

    set(candidate, _command.size() - _start, false, _queue);
}